

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O2

void lm_trie_fix_counts(ngram_raw_t **raw_ngrams,uint32 *counts,uint32 *fixed_counts,int order)

{
  int iVar1;
  uint uVar2;
  ngram_raw_t *pnVar3;
  void *__src;
  undefined8 uVar4;
  priority_queue_t *queue;
  undefined8 *element;
  long *ptr;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint32 words [5];
  uint32 raw_ngram_ptrs [4];
  
  queue = priority_queue_create((long)(order + -1),ngram_ord_comparator);
  words[4] = 0xffffffff;
  words[0] = 0xffffffff;
  words[1] = 0xffffffff;
  words[2] = 0xffffffff;
  words[3] = 0xffffffff;
  memcpy(fixed_counts,counts,(long)order * 4);
  for (lVar7 = 2; lVar7 <= order; lVar7 = lVar7 + 1) {
    if (counts[lVar7 + -1] != 0) {
      raw_ngram_ptrs[lVar7 + -2] = 0;
      element = (undefined8 *)
                __ckd_calloc__(1,0x18,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                               ,0xca);
      pnVar3 = raw_ngrams[lVar7 + -2];
      element[2] = *(undefined8 *)&pnVar3->order;
      uVar4 = *(undefined8 *)&pnVar3->prob;
      *element = pnVar3->words;
      element[1] = uVar4;
      *(int *)(element + 2) = (int)lVar7;
      priority_queue_add(queue,element);
    }
  }
  do {
    sVar5 = priority_queue_size(queue);
    if (sVar5 == 0) {
      sVar5 = priority_queue_size(queue);
      if (sVar5 == 0) {
        priority_queue_free(queue,(_func_void_void_ptr *)0x0);
        return;
      }
      __assert_fail("priority_queue_size(ngrams) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                    ,0xf4,"void lm_trie_fix_counts(ngram_raw_t **, uint32 *, uint32 *, int)");
    }
    ptr = (long *)priority_queue_poll(queue);
    iVar1 = (int)ptr[2];
    if (iVar1 == 2) {
      words._0_8_ = *(undefined8 *)*ptr;
      uVar6 = 1;
    }
    else {
      uVar6 = (ulong)(iVar1 - 1);
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        __src = (void *)*ptr;
        if (words[uVar8] != *(uint32 *)((long)__src + uVar8 * 4)) {
          if ((uint)uVar8 < 2) {
            uVar8 = 1;
          }
          memcpy(words,__src,(uVar8 & 0xffffffff) * 4 + 4);
          fixed_counts[uVar8 & 0xffffffff] = fixed_counts[uVar8 & 0xffffffff] + 1;
          lVar7 = ptr[2];
          uVar6 = (ulong)((int)lVar7 - 1);
          words[uVar6] = *(uint32 *)((long)__src + uVar6 * 4);
          uVar8 = (ulong)((int)lVar7 - 2);
          goto LAB_0011004d;
        }
      }
      words[uVar6] = *(uint32 *)(*ptr + uVar6 * 4);
    }
    uVar8 = (ulong)(iVar1 - 2);
    raw_ngram_ptrs[uVar8] = raw_ngram_ptrs[uVar8] + 1;
LAB_0011004d:
    uVar2 = raw_ngram_ptrs[uVar8];
    if (uVar2 < counts[uVar6]) {
      pnVar3 = raw_ngrams[uVar8];
      ptr[2] = *(long *)&pnVar3[uVar2].order;
      pnVar3 = pnVar3 + uVar2;
      lVar7 = *(long *)&pnVar3->prob;
      *ptr = (long)pnVar3->words;
      ptr[1] = lVar7;
      priority_queue_add(queue,ptr);
    }
    else {
      ckd_free(ptr);
    }
  } while( true );
}

Assistant:

void
lm_trie_fix_counts(ngram_raw_t ** raw_ngrams, uint32 * counts,
                   uint32 * fixed_counts, int order)
{
    priority_queue_t *ngrams =
        priority_queue_create(order - 1, &ngram_ord_comparator);
    uint32 raw_ngram_ptrs[NGRAM_MAX_ORDER - 1];
    uint32 words[NGRAM_MAX_ORDER];
    int i;

    memset(words, -1, sizeof(words));
    memcpy(fixed_counts, counts, order * sizeof(*fixed_counts));
    for (i = 2; i <= order; i++) {
        ngram_raw_t *tmp_ngram;
        
        if (counts[i - 1] <= 0)
            continue;

        raw_ngram_ptrs[i - 2] = 0;

        tmp_ngram =
            (ngram_raw_t *) ckd_calloc(1, sizeof(*tmp_ngram));
        *tmp_ngram = raw_ngrams[i - 2][0];
        tmp_ngram->order = i;
        priority_queue_add(ngrams, tmp_ngram);
    }

    for (;;) {
        int32 to_increment = TRUE;
        ngram_raw_t *top;
        if (priority_queue_size(ngrams) == 0) {
            break;
        }
        top = (ngram_raw_t *) priority_queue_poll(ngrams);
        if (top->order == 2) {
            memcpy(words, top->words, 2 * sizeof(*words));
        }
        else {
            for (i = 0; (uint32)i < top->order - 1; i++) {
                if (words[i] != top->words[i]) {
                    int num;
                    num = (i == 0) ? 1 : i;
                    memcpy(words, top->words,
                           (num + 1) * sizeof(*words));
                    fixed_counts[num]++;
                    to_increment = FALSE;
                    break;
                }
            }
            words[top->order - 1] = top->words[top->order - 1];
        }
        if (to_increment) {
            raw_ngram_ptrs[top->order - 2]++;
        }
        if (raw_ngram_ptrs[top->order - 2] < counts[top->order - 1]) {
            *top = raw_ngrams[top->order - 2][raw_ngram_ptrs[top->order - 2]];
            priority_queue_add(ngrams, top);
        }
        else {
            ckd_free(top);
        }
    }

    assert(priority_queue_size(ngrams) == 0);
    priority_queue_free(ngrams, NULL);
}